

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

DBTest * __thiscall leveldb::DBTest::Get(DBTest *this,string *k,Snapshot *snapshot)

{
  long *plVar1;
  bool bVar2;
  Snapshot *in_RCX;
  Status local_88 [6];
  Slice local_58;
  Status local_48;
  Status s;
  undefined1 local_38 [8];
  ReadOptions options;
  Snapshot *snapshot_local;
  string *k_local;
  DBTest *this_local;
  string *result;
  
  options.snapshot = in_RCX;
  ReadOptions::ReadOptions((ReadOptions *)local_38);
  options._0_8_ = options.snapshot;
  s.state_._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  plVar1 = *(long **)(k + 0x28);
  Slice::Slice(&local_58,(string *)snapshot);
  (**(code **)(*plVar1 + 0x28))(&local_48,plVar1,local_38,&local_58,this);
  bVar2 = Status::IsNotFound(&local_48);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)this,"NOT_FOUND");
  }
  else {
    bVar2 = Status::ok(&local_48);
    if (!bVar2) {
      Status::ToString_abi_cxx11_(local_88);
      std::__cxx11::string::operator=((string *)this,(string *)local_88);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  s.state_._7_1_ = 1;
  Status::~Status(&local_48);
  if ((s.state_._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

std::string Get(const std::string& k, const Snapshot* snapshot = nullptr) {
    ReadOptions options;
    options.snapshot = snapshot;
    std::string result;
    Status s = db_->Get(options, k, &result);
    if (s.IsNotFound()) {
      result = "NOT_FOUND";
    } else if (!s.ok()) {
      result = s.ToString();
    }
    return result;
  }